

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerMultiBr(Lowerer *this,Instr *instr)

{
  char cVar1;
  Instr *pIVar2;
  Instr *pIVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  undefined4 *puVar7;
  MultiBranchInstr *multiBrInstr;
  RegOpnd *indexOpnd;
  char *message;
  char *error;
  uint lineNumber;
  
  pIVar2 = instr->m_prev;
  if ((instr->m_src1 == (Opnd *)0x0) || (instr->m_src2 != (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2809,"(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)",
                       "Expected 1 src opnd on BrB");
    if (!bVar5) goto LAB_005bd601;
    *puVar7 = 0;
  }
  if (instr->m_kind == InstrKindBranch) {
    pIVar3 = instr[1].m_next;
    cVar1 = *(char *)((long)&instr[1]._vptr_Instr + 1);
    if (pIVar3 == (Instr *)0x0) {
      if (cVar1 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        error = "(m_isMultiBranch)";
        message = "m_isMultiBranch";
        lineNumber = 0x20e;
        goto LAB_005bd4a0;
      }
    }
    else if (cVar1 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      error = "(!m_isMultiBranch)";
      message = "!m_isMultiBranch";
      lineNumber = 0x209;
LAB_005bd4a0:
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,lineNumber,error,message);
      if (!bVar5) goto LAB_005bd601;
      *puVar7 = 0;
    }
    if (pIVar3 != (Instr *)0x0) goto LAB_005bd4ba;
  }
  else {
LAB_005bd4ba:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x280a,"(instr->IsBranchInstr() && instr->AsBranchInstr()->IsMultiBranch())"
                       ,"Bad Instruction Lowering Call to LowerMultiBr()");
    if (!bVar5) goto LAB_005bd601;
    *puVar7 = 0;
  }
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar5) goto LAB_005bd601;
    *puVar7 = 0;
  }
  multiBrInstr = IR::BranchInstr::AsMultiBrInstr((BranchInstr *)instr);
  indexOpnd = (RegOpnd *)IR::Instr::UnlinkSrc1(instr);
  OVar6 = IR::Opnd::GetKind((Opnd *)indexOpnd);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) {
LAB_005bd601:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  LowerJumpTableMultiBranch(this,multiBrInstr,indexOpnd);
  return pIVar2;
}

Assistant:

IR::Instr* Lowerer::LowerMultiBr(IR::Instr * instr)
{
    IR::Instr * instrPrev = instr->m_prev;

    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr, "Expected 1 src opnd on BrB");
    AssertMsg(instr->IsBranchInstr() && instr->AsBranchInstr()->IsMultiBranch(), "Bad Instruction Lowering Call to LowerMultiBr()");

    IR::MultiBranchInstr * multiBrInstr = instr->AsBranchInstr()->AsMultiBrInstr();
    IR::RegOpnd * offset = instr->UnlinkSrc1()->AsRegOpnd();
    LowerJumpTableMultiBranch(multiBrInstr, offset);

    return instrPrev;
}